

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O0

int CVodeSetMaxOrd(void *cvode_mem,int maxord)

{
  int in_ESI;
  CVodeMem in_RDI;
  int qmax_alloc;
  CVodeMem cv_mem;
  int local_2c;
  int local_28;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0xa3,"CVodeSetMaxOrd",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_ESI < 1) {
    cvProcessError(in_RDI,-0x16,0xab,"CVodeSetMaxOrd",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                   ,"maxord <= 0 illegal.");
    local_4 = -0x16;
  }
  else {
    local_28 = in_RDI->cv_qmax_alloc;
    if (in_RDI->cv_qmax_allocQ <= local_28) {
      local_28 = in_RDI->cv_qmax_allocQ;
    }
    if (local_28 < in_RDI->cv_qmax_allocS) {
      local_2c = local_28;
    }
    else {
      local_2c = in_RDI->cv_qmax_allocS;
    }
    if (local_2c < in_ESI) {
      cvProcessError(in_RDI,-0x16,0xb8,"CVodeSetMaxOrd",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                     ,"Illegal attempt to increase maximum method order.");
      local_4 = -0x16;
    }
    else {
      in_RDI->cv_qmax = in_ESI;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int CVodeSetMaxOrd(void* cvode_mem, int maxord)
{
  CVodeMem cv_mem;
  int qmax_alloc;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (maxord <= 0)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NEG_MAXORD);
    return (CV_ILL_INPUT);
  }

  /* Cannot increase maximum order beyond the value that
     was used when allocating memory */
  qmax_alloc = cv_mem->cv_qmax_alloc;
  qmax_alloc = SUNMIN(qmax_alloc, cv_mem->cv_qmax_allocQ);
  qmax_alloc = SUNMIN(qmax_alloc, cv_mem->cv_qmax_allocS);

  if (maxord > qmax_alloc)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_MAXORD);
    return (CV_ILL_INPUT);
  }

  cv_mem->cv_qmax = maxord;

  return (CV_SUCCESS);
}